

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::RgbaInputFile::FromYca::rotateBuf1(FromYca *this,int d)

{
  int iVar1;
  int i;
  long lVar2;
  Rgba *tmp [29];
  
  iVar1 = Imath_2_5::modp(d,0x1d);
  for (lVar2 = 0; lVar2 != 0x1d; lVar2 = lVar2 + 1) {
    tmp[lVar2] = this->_buf1[lVar2];
  }
  for (lVar2 = 0; lVar2 != 0x1d; lVar2 = lVar2 + 1) {
    this->_buf1[lVar2] = tmp[(iVar1 + (int)lVar2) % 0x1d];
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::rotateBuf1 (int d)
{
    d = modp (d, N + 2);

    Rgba *tmp[N + 2];

    for (int i = 0; i < N + 2; ++i)
	tmp[i] = _buf1[i];

    for (int i = 0; i < N + 2; ++i)
	_buf1[i] = tmp[(i + d) % (N + 2)];
}